

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

EmptyQueueExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyQueueExpressionSyntax,slang::syntax::EmptyQueueExpressionSyntax_const&>
          (BumpAllocator *this,EmptyQueueExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  SyntaxKind SVar11;
  undefined4 uVar12;
  EmptyQueueExpressionSyntax *pEVar13;
  
  pEVar13 = (EmptyQueueExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyQueueExpressionSyntax *)this->endPtr < pEVar13 + 1) {
    pEVar13 = (EmptyQueueExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pEVar13 + 1);
  }
  (pEVar13->closeBrace).info = (args->closeBrace).info;
  SVar11 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
  uVar12 = *(undefined4 *)
            &(args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4
  ;
  pSVar1 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode
  ;
  TVar7 = (args->openBrace).kind;
  uVar8 = (args->openBrace).field_0x2;
  NVar9.raw = (args->openBrace).numFlags.raw;
  uVar10 = (args->openBrace).rawLen;
  TVar3 = (args->closeBrace).kind;
  uVar4 = (args->closeBrace).field_0x2;
  NVar5.raw = (args->closeBrace).numFlags.raw;
  uVar6 = (args->closeBrace).rawLen;
  (pEVar13->openBrace).info = (args->openBrace).info;
  (pEVar13->closeBrace).kind = TVar3;
  (pEVar13->closeBrace).field_0x2 = uVar4;
  (pEVar13->closeBrace).numFlags = (NumericTokenFlags)NVar5.raw;
  (pEVar13->closeBrace).rawLen = uVar6;
  (pEVar13->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.previewNode =
       pSVar2;
  (pEVar13->openBrace).kind = TVar7;
  (pEVar13->openBrace).field_0x2 = uVar8;
  (pEVar13->openBrace).numFlags = (NumericTokenFlags)NVar9.raw;
  (pEVar13->openBrace).rawLen = uVar10;
  (pEVar13->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = SVar11;
  *(undefined4 *)
   &(pEVar13->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
       uVar12;
  (pEVar13->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = pSVar1;
  return pEVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }